

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_script.cpp
# Opt level: O2

ScriptDataResponseStruct *
cfd::js::api::ScriptStructApi::CreateMultisigScriptSig
          (ScriptDataResponseStruct *__return_storage_ptr__,
          CreateMultisigScriptSigRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&)>
  local_f8;
  ScriptDataResponseStruct local_d8;
  
  ScriptDataResponseStruct::ScriptDataResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_script.cpp:94:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateMultisigScriptSigRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_script.cpp:94:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"CreateMultisigScriptSig",&local_119);
  ExecuteStructApi<cfd::js::api::CreateMultisigScriptSigRequestStruct,cfd::js::api::ScriptDataResponseStruct>
            (&local_d8,(api *)request,(CreateMultisigScriptSigRequestStruct *)&local_118,&local_f8,
             in_R8);
  ScriptDataResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  ScriptDataResponseStruct::~ScriptDataResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

ScriptDataResponseStruct ScriptStructApi::CreateMultisigScriptSig(
    const CreateMultisigScriptSigRequestStruct& request) {
  auto call_func = [](const CreateMultisigScriptSigRequestStruct& request)
      -> ScriptDataResponseStruct {
    ScriptDataResponseStruct response;

    if (request.sign_params.size() == 0) {
      warn(CFD_LOG_SOURCE, "empty sign params.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to CreateMultisigScriptSig. empty sign params.");
    }

    Script redeem_script(request.redeem_script);
    std::vector<SignParameter> sign_list;

    SignParameter sign_data;
    for (const auto& stack_req : request.sign_params) {
      sign_data =
          TransactionStructApiBase::ConvertSignDataStructToSignParameter(
              stack_req);
      if (!stack_req.related_pubkey.empty()) {
        sign_data.SetRelatedPubkey(Pubkey(stack_req.related_pubkey));
      }
      sign_list.push_back(sign_data);
    }

    TransactionApi api;
    response.hex = api.CreateMultisigScriptSig(sign_list, redeem_script);
    return response;
  };

  ScriptDataResponseStruct result;
  result = ExecuteStructApi<
      CreateMultisigScriptSigRequestStruct, ScriptDataResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}